

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RCX;
  code *in_RDX;
  int *in_RSI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  float fVar4;
  bool item_selected;
  char *item_text;
  int i;
  ImVec2 *in_stack_00000038;
  ImGuiListClipper clipper;
  bool value_changed;
  ImVec2 size;
  float height_in_items_f;
  ImGuiContext *g;
  ImGuiListClipper *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff74;
  char *local_80;
  int local_78;
  int local_68;
  int local_64;
  byte local_45;
  ImVec2 local_44;
  float local_3c;
  ImGuiContext *pIVar5;
  bool local_1;
  
  pIVar5 = GImGui;
  if (in_R9D < 0) {
    in_R9D = ImMin<int>(in_R8D,7);
  }
  local_3c = (float)in_R9D + 0.25;
  fVar4 = GetTextLineHeightWithSpacing();
  fVar4 = ImFloor(fVar4 * local_3c + (pIVar5->Style).FramePadding.y * 2.0);
  ImVec2::ImVec2(&local_44,0.0,fVar4);
  bVar1 = BeginListBox((char *)clipper.TempData,(ImVec2 *)clipper._16_8_);
  if (bVar1) {
    local_45 = 0;
    ImGuiListClipper::ImGuiListClipper(in_stack_ffffffffffffff60);
    fVar4 = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin
              ((ImGuiListClipper *)CONCAT44(in_R8D,in_R9D),(int)((ulong)pIVar5 >> 0x20),
               SUB84(pIVar5,0));
    while (bVar1 = ImGuiListClipper::Step
                             ((ImGuiListClipper *)CONCAT44(in_stack_ffffffffffffff74,fVar4)), bVar1)
    {
      for (local_78 = local_68; local_78 < local_64; local_78 = local_78 + 1) {
        bVar2 = (*in_RDX)(in_RCX,local_78,&local_80);
        if ((bVar2 & 1) == 0) {
          local_80 = "*Unknown item*";
        }
        PushID((int)in_stack_ffffffffffffff74);
        bVar3 = local_78 == *in_RSI;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,0.0,0.0);
        bVar1 = Selectable((char *)clipper._8_8_,clipper.DisplayEnd._3_1_,clipper.DisplayStart,
                           in_stack_00000038);
        if (bVar1) {
          *in_RSI = local_78;
          local_45 = 1;
        }
        if (bVar3) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    EndListBox();
    if ((local_45 & 1) != 0) {
      MarkItemEdited((pIVar5->LastItemData).ID);
    }
    local_1 = (bool)(local_45 & 1);
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x50fa8f);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();

    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}